

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  char *__path;
  char **__argv;
  int iVar1;
  int *piVar2;
  UnitTest *this;
  char **__envp;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  allocator<char> local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  char *local_140;
  char *original_dir;
  string local_130;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  undefined8 *puStack_20;
  int gtest_retval;
  ExecDeathTestArgs *args;
  void *child_arg_local;
  
  puStack_20 = (undefined8 *)child_arg;
  args = (ExecDeathTestArgs *)child_arg;
  do {
    do {
      local_24 = close(*(int *)(puStack_20 + 1));
      bVar3 = false;
      if (local_24 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_24 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"CHECK failed: File ",&local_109);
      std::operator+(&local_e8,&local_108,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_c8,&local_e8,", line ");
      original_dir._4_4_ = 0x4e0;
      StreamableToString<int>(&local_130,(int *)((long)&original_dir + 4));
      std::operator+(&local_a8,&local_c8,&local_130);
      std::operator+(&local_88,&local_a8,": ");
      std::operator+(&local_68,&local_88,"close(args->close_fd)");
      std::operator+(&local_48,&local_68," != -1");
      DeathTestAbort(&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  this = UnitTest::GetInstance();
  local_140 = UnitTest::original_working_dir(this);
  iVar1 = chdir(local_140);
  if (iVar1 == 0) {
    __path = *(char **)*puStack_20;
    __argv = (char **)*puStack_20;
    __envp = GetEnviron();
    execve(__path,__argv,__envp);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"execve(",&local_2a9);
    std::operator+(&local_288,&local_2a8,*(char **)*puStack_20);
    std::operator+(&local_268,&local_288,", ...) in ");
    std::operator+(&local_248,&local_268,local_140);
    std::operator+(&local_228,&local_248," failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(&local_208,&local_228,&local_2d0);
    DeathTestAbort(&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"chdir(\"",&local_1c1);
    std::operator+(&local_1a0,&local_1c0,local_140);
    std::operator+(&local_180,&local_1a0,"\") failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(&local_160,&local_180,&local_1e8);
    DeathTestAbort(&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
  }
  return 1;
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execve() as it's a direct system call.  We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execve() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execve(args->argv[0], args->argv, GetEnviron());
  DeathTestAbort(std::string("execve(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}